

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_encoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialAttributeEncoder::SetPredictionSchemeParentAttributes
          (SequentialAttributeEncoder *this,PredictionSchemeInterface *ps)

{
  PointCloud *this_00;
  int iVar1;
  Type type;
  int32_t parent_att_id;
  int iVar2;
  PointAttribute *pPVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = 0;
  do {
    iVar1 = (*ps->_vptr_PredictionSchemeInterface[5])(ps);
    iVar5 = (int)uVar4;
    if (iVar1 <= iVar5) break;
    this_00 = this->encoder_->point_cloud_;
    type = (*ps->_vptr_PredictionSchemeInterface[6])(ps,uVar4);
    parent_att_id = PointCloud::GetNamedAttributeId(this_00,type);
    if (parent_att_id == -1) break;
    pPVar3 = PointCloudEncoder::GetPortableAttribute(this->encoder_,parent_att_id);
    iVar2 = (*ps->_vptr_PredictionSchemeInterface[7])(ps,pPVar3);
    uVar4 = (ulong)(iVar5 + 1);
  } while ((char)iVar2 != '\0');
  return iVar1 <= iVar5;
}

Assistant:

bool SequentialAttributeEncoder::SetPredictionSchemeParentAttributes(
    PredictionSchemeInterface *ps) {
  for (int i = 0; i < ps->GetNumParentAttributes(); ++i) {
    const int att_id = encoder_->point_cloud()->GetNamedAttributeId(
        ps->GetParentAttributeType(i));
    if (att_id == -1) {
      return false;  // Requested attribute does not exist.
    }
    if (!ps->SetParentAttribute(encoder_->GetPortableAttribute(att_id))) {
      return false;
    }
  }
  return true;
}